

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall
spoa::Graph::Edge::Edge(Edge *this,Node *tail,Node *head,uint32_t label,uint32_t weight)

{
  undefined4 in_EAX;
  undefined4 uStack_18;
  uint32_t label_local;
  
  _uStack_18 = CONCAT44(label,in_EAX);
  this->tail = tail;
  this->head = head;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->labels,1,&label_local,(allocator_type *)((long)&uStack_18 + 3));
  this->weight = (ulong)weight;
  return;
}

Assistant:

Graph::Edge::Edge(
    Node* tail,
    Node* head,
    std::uint32_t label,
    std::uint32_t weight)
    : tail(tail),
      head(head),
      labels(1, label),
      weight(weight) {
}